

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workerpool.c
# Opt level: O2

void workerpool_destroy(workerpool_t *wp)

{
  pthread_mutex_t *__mutex;
  zarray_t *__ptr;
  int iVar1;
  int i_1;
  long lVar2;
  int i;
  int iVar3;
  
  if (wp != (workerpool_t *)0x0) {
    iVar1 = wp->nthreads;
    if (1 < iVar1) {
      for (iVar3 = 0; iVar3 < iVar1; iVar3 = iVar3 + 1) {
        workerpool_add_task(wp,(_func_void_void_ptr *)0x0,(void *)0x0);
        iVar1 = wp->nthreads;
      }
      __mutex = &wp->mutex;
      pthread_mutex_lock((pthread_mutex_t *)__mutex);
      pthread_cond_broadcast((pthread_cond_t *)&wp->startcond);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      for (lVar2 = 0; lVar2 < wp->nthreads; lVar2 = lVar2 + 1) {
        pthread_join(wp->threads[lVar2],(void **)0x0);
      }
      pthread_mutex_destroy((pthread_mutex_t *)__mutex);
      pthread_cond_destroy((pthread_cond_t *)&wp->startcond);
      pthread_cond_destroy((pthread_cond_t *)&wp->endcond);
      free(wp->threads);
    }
    __ptr = wp->tasks;
    if (__ptr != (zarray_t *)0x0) {
      free(__ptr->data);
      free(__ptr);
    }
    free(wp);
    return;
  }
  return;
}

Assistant:

void workerpool_destroy(workerpool_t *wp)
{
    if (wp == NULL)
        return;

    // force all worker threads to exit.
    if (wp->nthreads > 1) {
        for (int i = 0; i < wp->nthreads; i++)
            workerpool_add_task(wp, NULL, NULL);

        pthread_mutex_lock(&wp->mutex);
        pthread_cond_broadcast(&wp->startcond);
        pthread_mutex_unlock(&wp->mutex);

        for (int i = 0; i < wp->nthreads; i++)
            pthread_join(wp->threads[i], NULL);

        pthread_mutex_destroy(&wp->mutex);
        pthread_cond_destroy(&wp->startcond);
        pthread_cond_destroy(&wp->endcond);
        free(wp->threads);
    }

    zarray_destroy(wp->tasks);
    free(wp);
}